

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O2

WasmConstLitNode __thiscall
Js::WebAssemblyEnvironment::GetGlobalValue(WebAssemblyEnvironment *this,WasmGlobal *global)

{
  code *pcVar1;
  bool bVar2;
  uint offset;
  int iVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  float fVar6;
  WasmConstLitNode WVar7;
  undefined8 local_28;
  
  if (global == (WasmGlobal *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0x99,"(global)","global");
    if (!bVar2) goto LAB_00c17855;
    *puVar4 = 0;
  }
  offset = WebAssemblyModule::GetOffsetForGlobal((this->module).ptr,global);
  local_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  switch(global->m_type) {
  case FirstLocalType:
    iVar3 = GetGlobalInternal<int>(this,offset);
    local_28 = (double)CONCAT44(local_28._4_4_,iVar3);
    uVar5 = extraout_RDX;
    break;
  case I64:
    local_28 = (double)GetGlobalInternal<long>(this,offset);
    uVar5 = extraout_RDX_02;
    break;
  case F32:
    fVar6 = GetGlobalInternal<float>(this,offset);
    local_28 = (double)CONCAT44(local_28._4_4_,fVar6);
    uVar5 = extraout_RDX_00;
    break;
  case F64:
    local_28 = GetGlobalInternal<double>(this,offset);
    uVar5 = extraout_RDX_01;
    break;
  case V128:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xa4,"((0))","Wasm.Simd globals not supported");
    if (!bVar2) {
LAB_00c17855:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  default:
    Wasm::WasmTypes::
    CompileAssertCases<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
  }
  WVar7.field_0._8_8_ = uVar5;
  WVar7.field_0.f64 = local_28;
  return (WasmConstLitNode)WVar7.field_0;
}

Assistant:

Wasm::WasmConstLitNode WebAssemblyEnvironment::GetGlobalValue(Wasm::WasmGlobal* global) const
{
    AssertOrFailFast(global);
    Wasm::WasmConstLitNode cnst;
    uint32 offset = module->GetOffsetForGlobal(global);

    switch (global->GetType())
    {
    case Wasm::WasmTypes::I32: cnst.i32 = GetGlobalInternal<int>(offset); break;
    case Wasm::WasmTypes::I64: cnst.i64 = GetGlobalInternal<int64>(offset); break;
    case Wasm::WasmTypes::F32: cnst.f32 = GetGlobalInternal<float>(offset); break;
    case Wasm::WasmTypes::F64: cnst.f64 = GetGlobalInternal<double>(offset); break;
#ifdef ENABLE_WASM_SIMD
    case Wasm::WasmTypes::V128: AssertOrFailFastMsg(UNREACHED, "Wasm.Simd globals not supported");
#endif
    default:
        Wasm::WasmTypes::CompileAssertCases<Wasm::WasmTypes::I32, Wasm::WasmTypes::I64, Wasm::WasmTypes::F32, Wasm::WasmTypes::F64, WASM_V128_CHECK_TYPE>();
    }
    return cnst;
}